

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

void __thiscall Fl_Pixmap::set_data(Fl_Pixmap *this,char **p)

{
  int local_20;
  int local_1c;
  int ncolors;
  int height;
  char **p_local;
  Fl_Pixmap *this_local;
  
  if (p != (char **)0x0) {
    _ncolors = p;
    p_local = (char **)this;
    __isoc99_sscanf(*p,"%*d%d%d",&local_1c,&local_20);
    if (local_20 < 0) {
      Fl_Image::data(&this->super_Fl_Image,_ncolors,local_1c + 2);
    }
    else {
      Fl_Image::data(&this->super_Fl_Image,_ncolors,local_1c + local_20 + 1);
    }
  }
  return;
}

Assistant:

void Fl_Pixmap::set_data(const char * const * p) {
  int	height,		// Number of lines in image
	ncolors;	// Number of colors in image

  if (p) {
    sscanf(p[0],"%*d%d%d", &height, &ncolors);
    if (ncolors < 0) data(p, height + 2);
    else data(p, height + ncolors + 1);
  }
}